

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

void Curl_bufq_init(bufq *q,size_t chunk_size,size_t max_chunks)

{
  q->chunk_size = 0;
  *(undefined8 *)&q->opts = 0;
  q->chunk_count = 0;
  q->max_chunks = 0;
  q->spare = (buf_chunk *)0x0;
  q->pool = (bufc_pool *)0x0;
  q->head = (buf_chunk *)0x0;
  q->tail = (buf_chunk *)0x0;
  q->chunk_size = chunk_size;
  q->max_chunks = max_chunks;
  q->opts = 0;
  return;
}

Assistant:

static void bufq_init(struct bufq *q, struct bufc_pool *pool,
                      size_t chunk_size, size_t max_chunks, int opts)
{
  DEBUGASSERT(chunk_size > 0);
  DEBUGASSERT(max_chunks > 0);
  memset(q, 0, sizeof(*q));
  q->chunk_size = chunk_size;
  q->max_chunks = max_chunks;
  q->pool = pool;
  q->opts = opts;
}